

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

char32_t anon_unknown.dwarf_13cc51::decodeUtf8Character(string *source,size_t *index)

{
  pointer pcVar1;
  char32_t cVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  
  sVar3 = *index;
  *index = sVar3 + 1;
  pcVar1 = (source->_M_dataplus)._M_p;
  cVar2 = (char32_t)pcVar1[sVar3];
  if ((cVar2 & 0xe0U) == 0xc0) {
    cVar2 = cVar2 & 0x1f;
    uVar4 = 1;
  }
  else {
    bVar5 = (cVar2 & 0xf0U) == 0xe0;
    if (bVar5) {
      cVar2 = cVar2 & 0xf;
    }
    uVar4 = (ulong)((uint)bVar5 * 2);
  }
  sVar3 = sVar3 + 2;
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    *index = sVar3;
    cVar2 = cVar2 << 6 | (byte)pcVar1[sVar3 - 1] & 0x3f;
    sVar3 = sVar3 + 1;
  }
  return cVar2;
}

Assistant:

char32_t decodeUtf8Character(const std::string &source, size_t &index)
	{
		size_t extraBytes = 0;
		int value = source[index++];

		if ((value & 0xE0) == 0xC0)
		{
			extraBytes = 1;
			value &= 0x1F;
		} else if ((value & 0xF0) == 0xE0)
		{
			extraBytes = 2;
			value &= 0x0F;
		}

		for (size_t i = 0; i < extraBytes; i++)
		{
			int b = source[index++];
			value = (value << 6) | (b & 0x3F);
		}

		return char32_t(value);
	}